

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

jx9_value * VmNewOperandStack(jx9_vm *pVm,sxu32 nInstr)

{
  undefined8 *puVar1;
  jx9_value *pjVar2;
  long lVar3;
  jx9_value *pjVar4;
  uint uVar5;
  
  uVar5 = nInstr + 0x10;
  pjVar2 = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator,uVar5 * 0x40);
  if (uVar5 != 0 && pjVar2 != (jx9_value *)0x0) {
    lVar3 = (ulong)uVar5 << 6;
    pjVar4 = pjVar2 + (nInstr + 0xf);
    do {
      *(undefined8 *)&(pjVar4->sBlob).nFlags = 0;
      *(undefined8 *)&pjVar4->nIdx = 0;
      (pjVar4->sBlob).pBlob = (void *)0x0;
      (pjVar4->sBlob).nByte = 0;
      (pjVar4->sBlob).mByte = 0;
      pjVar4->pVm = (jx9_vm *)0x0;
      (pjVar4->sBlob).pAllocator = (SyMemBackend *)0x0;
      (pjVar4->x).rVal = 0.0;
      *(undefined8 *)&pjVar4->iFlags = 0;
      *(jx9_vm **)((long)pjVar2 + lVar3 + -0x30) = pVm;
      puVar1 = (undefined8 *)((long)pjVar2 + lVar3 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(jx9_vm **)((long)pjVar2 + lVar3 + -0x28) = pVm;
      *(undefined4 *)((long)pjVar2 + lVar3 + -0x10) = 0;
      *(undefined4 *)((long)pjVar2 + lVar3 + -0x38) = 0x20;
      pjVar4 = pjVar4 + -1;
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != 0);
  }
  return pjVar2;
}

Assistant:

static jx9_value * VmNewOperandStack(
	jx9_vm *pVm, /* Target VM */
	sxu32 nInstr /* Total numer of generated bytecode instructions */
	)
{
	jx9_value *pStack;
  /* No instruction ever pushes more than a single element onto the
  ** stack and the stack never grows on successive executions of the
  ** same loop. So the total number of instructions is an upper bound
  ** on the maximum stack depth required.
  **
  ** Allocation all the stack space we will ever need.
  */
	nInstr += VM_STACK_GUARD;
	pStack = (jx9_value *)SyMemBackendAlloc(&pVm->sAllocator, nInstr * sizeof(jx9_value));
	if( pStack == 0 ){
		return 0;
	}
	/* Initialize the operand stack */
	while( nInstr > 0 ){
		jx9MemObjInit(&(*pVm), &pStack[nInstr - 1]);
		--nInstr;
	}
	/* Ready for bytecode execution */
	return pStack;
}